

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

UChar __thiscall
icu_63::FCDUTF8CollationIterator::handleGetTrailSurrogate(FCDUTF8CollationIterator *this)

{
  short sVar1;
  uint uVar2;
  UChar UVar3;
  char16_t *pcVar4;
  uint uVar5;
  
  if (this->state == IN_NORMALIZED) {
    uVar2 = (this->super_UTF8CollationIterator).pos;
    sVar1 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar5 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      uVar5 = (int)sVar1 >> 5;
    }
    UVar3 = L'\xffff';
    if (uVar2 < uVar5) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar4 = (this->normalized).fUnion.fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&(this->normalized).fUnion + 2);
      }
      UVar3 = pcVar4[(int)uVar2];
    }
    if ((UVar3 & 0xfc00U) == 0xdc00) {
      (this->super_UTF8CollationIterator).pos = uVar2 + 1;
      return UVar3;
    }
  }
  else {
    UVar3 = L'\0';
  }
  return UVar3;
}

Assistant:

UChar
FCDUTF8CollationIterator::handleGetTrailSurrogate() {
    if(state != IN_NORMALIZED) { return 0; }
    U_ASSERT(pos < normalized.length());
    UChar trail;
    if(U16_IS_TRAIL(trail = normalized[pos])) { ++pos; }
    return trail;
}